

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::(anonymous_namespace)::pquote_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Path *p)

{
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  Path::full_path_name_abi_cxx11_(&local_40,(Path *)this);
  ::std::__cxx11::string::string((string *)&local_60,"<",&local_81);
  ::std::__cxx11::string::string((string *)&local_80,">",&local_82);
  wquote(__return_storage_ptr__,&local_40,&local_60,&local_80);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string pquote(const Path &p) {
  return wquote(p.full_path_name(), "<", ">");
}